

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_efficiency.cpp
# Opt level: O0

void run<shuff>(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *inputs)

{
  bool bVar1;
  ostream *poVar2;
  unsigned_long *puVar3;
  size_type sVar4;
  uint32_t *b;
  vector<double,_std::allocator<double>_> *pvVar5;
  reference pvVar6;
  undefined1 *puVar7;
  undefined8 in_RDI;
  size_t j;
  size_t i_2;
  double decode_IPS;
  type decode_time_ns;
  time_point stop_decode;
  time_point start_decode;
  int i_1;
  size_t decode_time_ns_min;
  vector<unsigned_int,_std::allocator<unsigned_int>_> recover;
  double encode_IPS;
  type encoding_time_ns;
  time_point stop_encode;
  time_point start_encode;
  int i;
  size_t encoding_time_ns_min;
  size_t encoded_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *input;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  vector<double,_std::allocator<double>_> dec_speed;
  vector<double,_std::allocator<double>_> enc_speed;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffd78;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_fffffffffffffd80;
  undefined1 *puVar8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd88;
  value_type vVar9;
  allocator_type *in_stack_fffffffffffffd90;
  vector<double,_std::allocator<double>_> *this;
  string *in_stack_fffffffffffffd98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffda0;
  type in_stack_fffffffffffffdb0;
  ulong local_190;
  vector<double,_std::allocator<double>_> *local_188;
  string local_180 [32];
  double local_160;
  unsigned_long local_158;
  duration<long,_std::ratio<1L,_1000000000L>_> local_150;
  undefined8 local_148;
  undefined8 local_140;
  int local_134;
  unsigned_long local_130 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  double local_108;
  unsigned_long local_100;
  duration<long,_std::ratio<1L,_1000000000L>_> local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  int local_dc;
  unsigned_long local_d8;
  size_t local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  reference local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_78;
  undefined8 local_70;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  string local_28 [32];
  undefined8 local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"\\method{");
  shuff::name_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_28);
  poVar2 = std::operator<<(poVar2,"}  &");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x19f95c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x19f969);
  local_70 = local_8;
  local_78._M_current =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       std::
       vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ::begin(in_stack_fffffffffffffd78);
  local_80 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::end(in_stack_fffffffffffffd78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffd80,
                       (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                        *)in_stack_fffffffffffffd78);
    if (!bVar1) break;
    local_88 = __gnu_cxx::
               __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::operator*(&local_78);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_88);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x19fa04);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffda0,(size_type)in_stack_fffffffffffffd98,
               in_stack_fffffffffffffd90);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x19fa30);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_88);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x19fa5e);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffda0,(size_type)in_stack_fffffffffffffd98,
               in_stack_fffffffffffffd90);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x19fa8a);
    local_d0 = 0;
    local_d8 = std::numeric_limits<unsigned_long>::max();
    for (local_dc = 0; local_dc < 5; local_dc = local_dc + 1) {
      local_e8 = std::chrono::_V2::system_clock::now();
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x19fad6);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_88);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19fb08);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_a0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19fb32);
      local_d0 = shuff::encode((uint32_t *)in_stack_fffffffffffffd90,
                               (size_t)in_stack_fffffffffffffd88,
                               (uint8_t *)in_stack_fffffffffffffd80,
                               (size_t)in_stack_fffffffffffffd78,(uint8_t *)0x19fb5a);
      local_f0 = std::chrono::_V2::system_clock::now();
      local_f8.__r = (rep)std::chrono::operator-
                                    (in_stack_fffffffffffffd88,
                                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)in_stack_fffffffffffffd80);
      local_100 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_f8);
      puVar3 = std::min<unsigned_long>(&local_100,&local_d8);
      local_d8 = *puVar3;
    }
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_88);
    local_108 = compute_ips(sVar4,local_d8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffffda0,(size_type)in_stack_fffffffffffffd98);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_88);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x19fce7);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffda0,
               (size_type)in_stack_fffffffffffffd98,(allocator_type *)in_stack_fffffffffffffd90);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x19fd0d);
    local_130[0] = std::numeric_limits<unsigned_long>::max();
    for (local_134 = 0; local_134 < 5; local_134 = local_134 + 1) {
      local_140 = std::chrono::_V2::system_clock::now();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19fd52);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_a0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x19fd78);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_120);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19fd99);
      shuff::decode((uint8_t *)in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88,
                    (uint32_t *)in_stack_fffffffffffffd80,(size_t)in_stack_fffffffffffffd78,
                    (uint8_t *)0x19fdb5);
      local_148 = std::chrono::_V2::system_clock::now();
      in_stack_fffffffffffffdb0 =
           std::chrono::operator-
                     (in_stack_fffffffffffffd88,
                      (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_fffffffffffffd80);
      local_150.__r = in_stack_fffffffffffffdb0.__r;
      local_158 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_150);
      puVar3 = std::min<unsigned_long>(&local_158,local_130);
      local_130[0] = *puVar3;
    }
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_88);
    local_160 = compute_ips(sVar4,local_130[0]);
    in_stack_fffffffffffffd98 =
         (string *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x19feaa);
    in_stack_fffffffffffffda0 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x19febc);
    b = (uint32_t *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_88);
    shuff::name_abi_cxx11_();
    REQUIRE_EQUAL((uint32_t *)in_stack_fffffffffffffdb0.__r,b,(size_t)in_stack_fffffffffffffda0,
                  in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(local_180);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd90,
               (value_type_conflict6 *)in_stack_fffffffffffffd88);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd90,
               (value_type_conflict6 *)in_stack_fffffffffffffd88);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd90);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd90);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd90);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&local_78);
  }
  local_188 = (vector<double,_std::allocator<double>_> *)0x0;
  while( true ) {
    this = local_188;
    pvVar5 = (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::size(&local_50);
    if (pvVar5 <= this) break;
    for (local_190 = 0; local_190 < (ulong)((long)local_188 << 2); local_190 = local_190 + 1) {
      printf(" ");
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_50,(size_type)local_188);
    vVar9 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_68,(size_type)local_188);
    printf("%15.4f  &  %15.4f  ",vVar9,*pvVar6);
    puVar8 = (undefined1 *)
             ((long)&(local_188->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start + 1);
    puVar7 = (undefined1 *)std::vector<double,_std::allocator<double>_>::size(&local_50);
    if (puVar8 == puVar7) {
      printf("\\\\ \n\n");
    }
    else {
      printf("&\n");
    }
    local_188 = (vector<double,_std::allocator<double>_> *)
                ((long)&(local_188->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1);
  }
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  return;
}

Assistant:

void run(std::vector<std::vector<uint32_t>>& inputs)
{
    std::cout << "\\method{" << t_compressor::name() << "}  &" << std::endl;

    std::vector<double> enc_speed;
    std::vector<double> dec_speed;
    for (const auto& input : inputs) {
        // (1) encode
        std::vector<uint8_t> encoded_data(input.size() * 8);
        std::vector<uint8_t> tmp_buf(input.size() * 8);

        size_t encoded_bytes = 0;
        size_t encoding_time_ns_min = std::numeric_limits<size_t>::max();
        for (int i = 0; i < NUM_RUNS; i++) {
            auto start_encode = std::chrono::high_resolution_clock::now();
            encoded_bytes = t_compressor::encode(input.data(), input.size(),
                encoded_data.data(), encoded_data.size(), tmp_buf.data());
            auto stop_encode = std::chrono::high_resolution_clock::now();
            auto encoding_time_ns = stop_encode - start_encode;
            encoding_time_ns_min = std::min(
                (size_t)encoding_time_ns.count(), encoding_time_ns_min);
        }
        double encode_IPS = compute_ips(input.size(), encoding_time_ns_min);

        // (2) decode
        encoded_data.resize(encoded_bytes);
        std::vector<uint32_t> recover(input.size());
        size_t decode_time_ns_min = std::numeric_limits<size_t>::max();
        for (int i = 0; i < NUM_RUNS; i++) {
            auto start_decode = std::chrono::high_resolution_clock::now();
            t_compressor::decode(encoded_data.data(), encoded_data.size(),
                recover.data(), recover.size(), tmp_buf.data());
            auto stop_decode = std::chrono::high_resolution_clock::now();
            auto decode_time_ns = stop_decode - start_decode;
            decode_time_ns_min
                = std::min((size_t)decode_time_ns.count(), decode_time_ns_min);
        }
        double decode_IPS = compute_ips(input.size(), decode_time_ns_min);

        // (3) verify
        REQUIRE_EQUAL(
            input.data(), recover.data(), input.size(), t_compressor::name());

        enc_speed.push_back(encode_IPS);
        dec_speed.push_back(decode_IPS);
    }

    for (size_t i = 0; i < enc_speed.size(); i++) {
        for (size_t j = 0; j < i * 4; j++)
            printf(" ");
        printf("%15.4f  &  %15.4f  ", enc_speed[i], dec_speed[i]);
        if (i + 1 == enc_speed.size())
            printf("\\\\ \n\n");
        else
            printf("&\n");
    }
}